

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bork.cpp
# Opt level: O2

void pretty_print(string *filename)

{
  size_type sVar1;
  size_type sVar2;
  string buf;
  string s;
  string local_458 [32];
  ifstream f;
  int aiStack_418 [122];
  ofstream of;
  
  std::ifstream::ifstream(&f,(string *)filename,_S_in);
  std::operator+(&buf,filename,"___");
  std::ofstream::ofstream(&of,(string *)&buf,_S_out);
  std::__cxx11::string::~string((string *)&buf);
  buf._M_dataplus._M_p = (pointer)&buf.field_2;
  buf._M_string_length = 0;
  buf.field_2._M_local_buf[0] = '\0';
  while (*(int *)((long)aiStack_418 + *(long *)(_f + -0x18)) == 0) {
    read_exp(&f,&buf);
    std::__cxx11::string::string(local_458,(string *)&buf);
    util::pprint(&s,local_458);
    std::__cxx11::string::~string(local_458);
    sVar1 = s._M_string_length;
    for (sVar2 = 0; sVar1 != sVar2; sVar2 = sVar2 + 1) {
      std::ostream::put((char)&of);
    }
    std::__cxx11::string::~string((string *)&s);
  }
  std::ifstream::close();
  std::ofstream::close();
  std::__cxx11::string::~string((string *)&buf);
  std::ofstream::~ofstream(&of);
  std::ifstream::~ifstream(&f);
  return;
}

Assistant:

void pretty_print(const std::string &filename) {

  std::ifstream f(filename);
  std::ofstream of(filename + "___");
  std::string buf;

  while (f.good()) {
    read_exp(f, buf);
    std::string s = util::pprint(buf);
    for (auto d : s) {
      of.put(d);
    }
  }

  f.close();
  of.close();

}